

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O1

int Bal_ManDeriveCuts(Bal_Man_t *p,int iFan0,int iFan1,int iFan2,int fCompl0,int fCompl1,int fCompl2
                     ,int fUnit0,int fUnit1,int fUnit2,int fIsXor,int Target,int fSave)

{
  ulong *puVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  Bal_Cut_t *pBVar4;
  word wVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  void *pvVar9;
  void **ppvVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  undefined1 *puVar24;
  int nSizeB_2;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  Bal_Cut_t *pBVar34;
  int *piVar35;
  ulong uVar36;
  long lVar37;
  Bal_Cut_t *pCutsR [8];
  Bal_Cut_t pCutSet [8];
  ulong local_200;
  ulong *local_1e8;
  ulong *local_1e0;
  Bal_Cut_t *local_1b8 [8];
  Bal_Cut_t local_178 [8];
  
  if ((iFan0 < 0) || (pVVar3 = p->vCutSets, pVVar3->nSize <= iFan0)) {
LAB_006826c6:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if ((fUnit0 == 0) &&
     (puVar24 = (undefined1 *)pVVar3->pArray[(uint)iFan0], (ulong *)puVar24 != (ulong *)0x0)) {
    uVar11 = p->nCutNum;
    if ((int)uVar11 < 1) {
      uVar18 = 0;
    }
    else {
      puVar12 = (uint *)((long)puVar24 + 0xc);
      uVar18 = 0;
      do {
        if (0xf7ffffff < *puVar12) goto LAB_00681ab8;
        uVar18 = uVar18 + 1;
        puVar12 = puVar12 + 10;
      } while (uVar11 != uVar18);
      uVar18 = (ulong)uVar11;
    }
  }
  else {
    if (p->vCosts->nSize <= iFan0) goto LAB_006826e5;
    Bal_ManPrepareSet_CutTemp._8_4_ = (p->vCosts->pArray[(uint)iFan0] >> 4) + 1;
    puVar24 = Bal_ManPrepareSet_CutTemp;
    Bal_ManPrepareSet_CutTemp._0_8_ = 1L << ((byte)iFan0 & 0x3f);
    Bal_ManPrepareSet_CutTemp._12_4_ = 0x8000002;
    uVar18 = 1;
    Bal_ManPrepareSet_CutTemp._16_4_ = iFan0;
  }
LAB_00681ab8:
  if ((iFan1 < 0) || (pVVar3->nSize <= iFan1)) goto LAB_006826c6;
  if ((fUnit1 == 0) && (local_1e8 = (ulong *)pVVar3->pArray[(uint)iFan1], local_1e8 != (ulong *)0x0)
     ) {
    uVar11 = p->nCutNum;
    if ((int)uVar11 < 1) {
      uVar16 = 0;
    }
    else {
      puVar12 = (uint *)((long)local_1e8 + 0xc);
      uVar16 = 0;
      do {
        if (0xf7ffffff < *puVar12) goto LAB_00681b75;
        uVar16 = uVar16 + 1;
        puVar12 = puVar12 + 10;
      } while (uVar11 != uVar16);
      uVar16 = (ulong)uVar11;
    }
  }
  else {
    if (p->vCosts->nSize <= iFan1) goto LAB_006826e5;
    Bal_ManPrepareSet_CutTemp._48_4_ = (p->vCosts->pArray[(uint)iFan1] >> 4) + 1;
    Bal_ManPrepareSet_CutTemp._52_4_ = 0x8000002;
    Bal_ManPrepareSet_CutTemp._40_8_ = 1L << ((byte)iFan1 & 0x3f);
    uVar16 = 1;
    local_1e8 = (ulong *)(Bal_ManPrepareSet_CutTemp + 0x28);
    Bal_ManPrepareSet_CutTemp._56_4_ = iFan1;
  }
LAB_00681b75:
  iVar23 = (int)uVar18;
  iVar14 = (int)uVar16;
  uVar11 = p->nCutNum;
  pBVar34 = local_178;
  memset(pBVar34,0,(long)(int)uVar11 * 0x28);
  uVar18 = (ulong)uVar11;
  if (0 < (long)(int)uVar11) {
    uVar16 = 0;
    do {
      local_1b8[uVar16] = pBVar34;
      uVar16 = uVar16 + 1;
      pBVar34 = pBVar34 + 1;
    } while (uVar18 != uVar16);
  }
  puVar1 = (ulong *)((long)puVar24 + (long)iVar23 * 5 * 8);
  if (iFan2 < 1) {
    if (iVar23 < 1) {
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      do {
        puVar17 = local_1e8;
        if (0 < iVar14) {
          do {
            uVar16 = (*puVar17 | *(ulong *)puVar24) -
                     ((*puVar17 | *(ulong *)puVar24) >> 1 & 0x5555555555555555);
            uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
            uVar11 = p->nLutSize;
            if ((int)(uint)(byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                 >> 0x38) <= (int)uVar11) {
              iVar23 = (int)uVar18;
              pBVar34 = local_1b8[iVar23];
              uVar8 = *(uint *)((long)puVar24 + 0xc);
              uVar22 = uVar8 >> 0x1b;
              uVar27 = *(uint *)((long)puVar17 + 0xc);
              uVar26 = uVar27 >> 0x1b;
              if ((uVar22 == uVar11) && (uVar26 == uVar11)) {
                if (0x7ffffff < uVar8) {
                  uVar16 = 0;
                  do {
                    iVar29 = *(int *)((long)puVar24 + uVar16 * 4 + 0x10);
                    if (iVar29 != *(int *)((long)puVar17 + uVar16 * 4 + 0x10)) goto LAB_00681f4b;
                    pBVar34->pLeaves[uVar16] = iVar29;
                    uVar16 = uVar16 + 1;
                  } while (uVar22 != uVar16);
                }
LAB_00681e3d:
                *(uint *)&pBVar34->field_0xc = uVar11 << 0x1b | 0x7ffffff;
                pBVar34->Sign = *puVar17 | *(ulong *)puVar24;
                iVar29 = (int)puVar17[1];
                if ((int)puVar17[1] < (int)*(ulong *)((long)puVar24 + 8)) {
                  iVar29 = (int)*(ulong *)((long)puVar24 + 8);
                }
                pBVar34->Delay = iVar29;
                if (iVar29 != Target) {
                  __assert_fail("pCutsR[nCutsR]->Delay == Target",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                                ,0x1bc,
                                "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                               );
                }
                if (0 < iVar23) {
                  pBVar34 = local_1b8[uVar18];
                  uVar11 = *(uint *)&pBVar34->field_0xc >> 0x1b;
                  uVar16 = 0;
                  do {
                    pBVar4 = local_1b8[uVar16];
                    uVar8 = *(uint *)&pBVar4->field_0xc >> 0x1b;
                    if ((uVar8 <= uVar11) && ((pBVar4->Sign & ~pBVar34->Sign) == 0)) {
                      if (uVar11 == uVar8) {
                        if (*(uint *)&pBVar34->field_0xc < 0x8000000) goto LAB_00681f4b;
                        uVar20 = 0;
                        while (pBVar34->pLeaves[uVar20] == pBVar4->pLeaves[uVar20]) {
                          uVar20 = uVar20 + 1;
                          if (uVar11 == uVar20) goto LAB_00681f4b;
                        }
                      }
                      else {
                        if (uVar11 <= uVar8) {
LAB_0068264a:
                          __assert_fail("nSizeB > nSizeC",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                                        ,0x143,
                                        "int Bal_SetCutIsContainedOrder(Bal_Cut_t *, Bal_Cut_t *)");
                        }
                        if (*(uint *)&pBVar4->field_0xc < 0x8000000) goto LAB_00681f4b;
                        uVar20 = 0;
                        uVar27 = 0;
                        do {
                          if (pBVar4->pLeaves[(int)uVar27] < pBVar34->pLeaves[uVar20]) break;
                          if ((pBVar34->pLeaves[uVar20] == pBVar4->pLeaves[(int)uVar27]) &&
                             (uVar27 = uVar27 + 1, uVar27 == uVar8)) goto LAB_00681f4b;
                          uVar20 = uVar20 + 1;
                        } while (uVar11 != uVar20);
                      }
                    }
                    uVar16 = uVar16 + 1;
                  } while (uVar16 != uVar18);
                }
                uVar11 = Bal_SetAddCut(local_1b8,iVar23,p->nCutNum);
                uVar18 = (ulong)uVar11;
              }
              else if (uVar11 != 0) {
                lVar37 = 0;
                iVar28 = 0;
                iVar29 = 0;
LAB_00681d64:
                iVar25 = *(int *)((long)puVar24 + (long)iVar28 * 4 + 0x10);
                iVar32 = *(int *)((long)puVar17 + (long)iVar29 * 4 + 0x10);
                iVar15 = (int)lVar37;
                if (iVar25 < iVar32) {
                  iVar28 = iVar28 + 1;
                  pBVar34->pLeaves[lVar37] = iVar25;
                  iVar25 = iVar29;
                  if (iVar28 < (int)uVar22) goto LAB_00681da5;
LAB_00681db1:
                  if ((int)((uVar27 >> 0x1b) + iVar15 + 1) <= (int)(uVar11 + iVar25)) {
                    if (iVar25 < (int)uVar26) {
                      uVar16 = (ulong)iVar25;
                      do {
                        lVar2 = uVar16 * 4;
                        uVar16 = uVar16 + 1;
                        pBVar34->pLeaves[lVar37 + 1] = *(int *)((long)puVar17 + lVar2 + 0x10);
                        lVar37 = lVar37 + 1;
                      } while (uVar26 != uVar16);
                      iVar15 = (int)lVar37;
                    }
                    uVar11 = iVar15 + 1;
                    goto LAB_00681e3d;
                  }
                }
                else {
                  if (iVar32 < iVar25) {
                    pBVar34->pLeaves[lVar37] = iVar32;
                  }
                  else {
                    iVar28 = iVar28 + 1;
                    pBVar34->pLeaves[lVar37] = iVar25;
                    iVar25 = iVar29 + 1;
                    if ((int)uVar22 <= iVar28) goto LAB_00681db1;
                  }
                  iVar29 = iVar29 + 1;
                  if (iVar29 < (int)uVar26) goto LAB_00681da5;
                  if ((int)((uVar8 >> 0x1b) + iVar15 + 1) <= (int)(uVar11 + iVar28)) {
                    if (iVar28 < (int)uVar22) {
                      uVar16 = (ulong)iVar28;
                      do {
                        lVar2 = uVar16 * 4;
                        uVar16 = uVar16 + 1;
                        pBVar34->pLeaves[lVar37 + 1] = *(int *)((long)puVar24 + lVar2 + 0x10);
                        lVar37 = lVar37 + 1;
                      } while (uVar22 != uVar16);
                      iVar15 = (int)lVar37;
                    }
                    uVar11 = iVar15 + 1;
                    goto LAB_00681e3d;
                  }
                }
              }
            }
LAB_00681f4b:
            puVar17 = puVar17 + 5;
          } while (puVar17 < local_1e8 + (long)iVar14 * 5);
        }
        puVar24 = (undefined1 *)((long)puVar24 + 0x28);
      } while (puVar24 < puVar1);
    }
  }
  else {
    if (p->vCutSets->nSize <= iFan2) goto LAB_006826c6;
    if ((fUnit2 == 0) &&
       (local_1e0 = (ulong *)p->vCutSets->pArray[(uint)iFan2], local_1e0 != (ulong *)0x0)) {
      if ((int)uVar11 < 1) {
        local_200 = 0;
      }
      else {
        puVar12 = (uint *)((long)local_1e0 + 0xc);
        local_200 = 0;
        uVar16 = local_200;
        do {
          local_200 = uVar16;
          if (0xf7ffffff < *puVar12) break;
          uVar16 = local_200 + 1;
          puVar12 = puVar12 + 10;
          local_200 = uVar18;
        } while (uVar18 != uVar16);
      }
    }
    else {
      if (p->vCosts->nSize <= iFan2) {
LAB_006826e5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Bal_ManPrepareSet_CutTemp._88_4_ = (p->vCosts->pArray[(uint)iFan2] >> 4) + 1;
      Bal_ManPrepareSet_CutTemp._92_4_ = 0x8000002;
      Bal_ManPrepareSet_CutTemp._80_8_ = 1L << ((byte)iFan2 & 0x3f);
      local_200 = 1;
      local_1e0 = (ulong *)(Bal_ManPrepareSet_CutTemp + 0x50);
      Bal_ManPrepareSet_CutTemp._96_4_ = iFan2;
    }
    if (iVar23 < 1) {
      uVar18 = 0;
    }
    else {
      uVar18 = 0;
      do {
        puVar17 = local_1e8;
        if (0 < iVar14) {
          do {
            puVar19 = local_1e0;
            if (0 < (int)local_200) {
              do {
                uVar16 = *puVar17 | *(ulong *)puVar24 | *puVar19;
                uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
                uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
                uVar11 = p->nLutSize;
                if ((int)(uint)(byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38) <= (int)uVar11) {
                  iVar29 = (int)uVar18;
                  pBVar34 = local_1b8[iVar29];
                  uVar8 = *(uint *)((long)puVar24 + 0xc);
                  uVar27 = *(uint *)((long)puVar17 + 0xc);
                  uVar22 = *(uint *)((long)puVar19 + 0xc);
                  uVar16 = 0;
                  iVar23 = 0x7ffffff;
                  uVar26 = 0;
                  uVar20 = 0;
                  uVar33 = 0;
                  while( true ) {
                    iVar25 = 1000000000;
                    iVar28 = 1000000000;
                    if (uVar33 != uVar8 >> 0x1b) {
                      iVar28 = *(int *)((long)puVar24 + (ulong)uVar33 * 4 + 0x10);
                    }
                    if ((uint)uVar20 != uVar27 >> 0x1b) {
                      iVar25 = *(int *)((long)puVar17 + uVar20 * 4 + 0x10);
                    }
                    iVar32 = 1000000000;
                    if (uVar26 != uVar22 >> 0x1b) {
                      iVar32 = *(int *)((long)puVar19 + (ulong)uVar26 * 4 + 0x10);
                    }
                    iVar15 = iVar25;
                    if (iVar28 < iVar25) {
                      iVar15 = iVar28;
                    }
                    iVar30 = iVar32;
                    if (iVar15 < iVar32) {
                      iVar30 = iVar15;
                    }
                    if (iVar30 == 1000000000) break;
                    if (uVar11 == uVar16) goto LAB_006821c7;
                    pBVar34->pLeaves[uVar16] = iVar30;
                    uVar16 = uVar16 + 1;
                    uVar33 = uVar33 + (iVar28 == iVar30);
                    uVar20 = (ulong)((uint)uVar20 + (uint)(iVar25 == iVar30));
                    uVar26 = uVar26 + (iVar32 <= iVar15);
                    iVar23 = iVar23 + 0x8000000;
                  }
                  *(int *)&pBVar34->field_0xc = iVar23;
                  pBVar34->Sign = *puVar17 | *(ulong *)puVar24 | *puVar19;
                  iVar23 = (int)puVar19[1];
                  if ((int)puVar19[1] < (int)puVar17[1]) {
                    iVar23 = (int)puVar17[1];
                  }
                  if (iVar23 < (int)*(ulong *)((long)puVar24 + 8)) {
                    iVar23 = (int)*(ulong *)((long)puVar24 + 8);
                  }
                  pBVar34->Delay = iVar23;
LAB_006821c7:
                  if (iVar30 == 1000000000) {
                    if (pBVar34->Delay != Target) {
                      __assert_fail("pCutsR[nCutsR]->Delay == Target",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                                    ,0x1ab,
                                    "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                                   );
                    }
                    if (0 < iVar29) {
                      pBVar34 = local_1b8[uVar18];
                      uVar11 = *(uint *)&pBVar34->field_0xc >> 0x1b;
                      uVar16 = 0;
                      do {
                        pBVar4 = local_1b8[uVar16];
                        uVar8 = *(uint *)&pBVar4->field_0xc >> 0x1b;
                        if ((uVar8 <= uVar11) && ((pBVar4->Sign & ~pBVar34->Sign) == 0)) {
                          if (uVar11 == uVar8) {
                            if (*(uint *)&pBVar34->field_0xc < 0x8000000) goto LAB_0068231f;
                            uVar20 = 0;
                            while (pBVar34->pLeaves[uVar20] == pBVar4->pLeaves[uVar20]) {
                              uVar20 = uVar20 + 1;
                              if (uVar11 == uVar20) goto LAB_0068231f;
                            }
                          }
                          else {
                            if (uVar11 <= uVar8) goto LAB_0068264a;
                            if (*(uint *)&pBVar4->field_0xc < 0x8000000) goto LAB_0068231f;
                            uVar20 = 0;
                            uVar27 = 0;
                            do {
                              if (pBVar4->pLeaves[(int)uVar27] < pBVar34->pLeaves[uVar20]) break;
                              if ((pBVar34->pLeaves[uVar20] == pBVar4->pLeaves[(int)uVar27]) &&
                                 (uVar27 = uVar27 + 1, uVar27 == uVar8)) goto LAB_0068231f;
                              uVar20 = uVar20 + 1;
                            } while (uVar11 != uVar20);
                          }
                        }
                        uVar16 = uVar16 + 1;
                      } while (uVar16 != uVar18);
                    }
                    uVar11 = Bal_SetAddCut(local_1b8,iVar29,p->nCutNum);
                    uVar18 = (ulong)uVar11;
                  }
                }
LAB_0068231f:
                puVar19 = puVar19 + 5;
              } while (puVar19 < local_1e0 + (long)(int)local_200 * 5);
            }
            puVar17 = puVar17 + 5;
          } while (puVar17 < local_1e8 + (long)iVar14 * 5);
        }
        puVar24 = (undefined1 *)((long)puVar24 + 0x28);
      } while (puVar24 < puVar1);
    }
  }
  iVar14 = (int)uVar18;
  if (iVar14 == 0) {
    return 0xffffffff;
  }
  if ((iVar14 < 1) || (p->nCutNum <= iVar14)) {
    __assert_fail("nCutsR > 0 && nCutsR < p->nCutNum",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                  ,0x1c9,
                  "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                 );
  }
  uVar11 = *(uint *)&local_1b8[0]->field_0xc >> 0x1b | local_1b8[0]->Delay << 4;
  uVar16 = 0;
  do {
    pBVar34 = local_1b8[uVar16];
    uVar8 = *(uint *)&pBVar34->field_0xc;
    if (0x37ffffff < uVar8) {
      __assert_fail("pCut0->nLeaves <= BAL_LEAF_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0xc0,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
    }
    uVar27 = uVar8 >> 0x1b;
    if (uVar8 < 0x8000000) {
      uVar21 = 0;
    }
    else {
      uVar20 = 0;
      uVar21 = 0;
      do {
        uVar21 = uVar21 | 1L << ((ulong)(byte)pBVar34->pLeaves[uVar20] & 0x3f);
        uVar20 = uVar20 + 1;
      } while (uVar27 != uVar20);
    }
    if (pBVar34->Sign != uVar21) {
      __assert_fail("pCut0->Sign == Bal_CutGetSign(pCut0->pLeaves, pCut0->nLeaves)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0xc1,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
    }
    uVar20 = (ulong)uVar27;
    if (0x7ffffff < uVar8) {
      piVar35 = pBVar34->pLeaves;
      uVar31 = 0;
      uVar21 = uVar20;
      do {
        piVar35 = piVar35 + 1;
        uVar21 = uVar21 - 1;
        uVar36 = uVar31 + 1;
        if (uVar36 < uVar20) {
          uVar13 = 0;
          do {
            if (piVar35[uVar13] <= pBVar34->pLeaves[uVar31]) {
              __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                            ,0xc5,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
            }
            uVar13 = uVar13 + 1;
          } while (uVar21 != uVar13);
        }
        uVar31 = uVar36;
      } while (uVar36 != uVar20);
    }
    uVar21 = 0;
    do {
      pBVar4 = local_1b8[uVar21];
      if (pBVar34 != pBVar4) {
        if (*(uint *)&pBVar4->field_0xc < 0x8000000) {
LAB_006825ed:
          __assert_fail("Value == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                        ,0xce,"int Bal_SetCheckArray(Bal_Cut_t **, int)");
        }
        uVar31 = 0;
        do {
          uVar36 = 0;
          if (0x7ffffff < uVar8) {
            uVar36 = 0;
            do {
              if (pBVar4->pLeaves[uVar31] == pBVar34->pLeaves[uVar36]) goto LAB_00682465;
              uVar36 = uVar36 + 1;
            } while (uVar20 != uVar36);
            uVar36 = (ulong)uVar27;
          }
LAB_00682465:
          if ((uint)uVar36 == uVar27) break;
          uVar31 = uVar31 + 1;
          if (uVar31 == *(uint *)&pBVar4->field_0xc >> 0x1b) goto LAB_006825ed;
        } while( true );
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar18);
    uVar16 = uVar16 + 1;
  } while (uVar16 != uVar18);
  if (fSave == 0) {
    return uVar11;
  }
  if (local_1b8[0]->Delay << 4 < 0) {
    return uVar11;
  }
  pvVar9 = calloc((long)p->nCutNum,0x28);
  pVVar3 = p->vCutSets;
  uVar8 = pVVar3->nCap;
  if (pVVar3->nSize == uVar8) {
    if ((int)uVar8 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(0x80);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar10;
      iVar23 = 0x10;
    }
    else {
      iVar23 = uVar8 * 2;
      if (iVar23 <= (int)uVar8) goto LAB_00682530;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar3->pArray,(ulong)uVar8 << 4);
      }
      pVVar3->pArray = ppvVar10;
    }
    pVVar3->nCap = iVar23;
  }
LAB_00682530:
  iVar23 = pVVar3->nSize;
  pVVar3->nSize = iVar23 + 1;
  pVVar3->pArray[iVar23] = pvVar9;
  if (p->vCutSets->nSize != p->pNew->nObjs) {
    __assert_fail("Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                  ,0x1d0,
                  "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
                 );
  }
  uVar16 = 1;
  if (1 < iVar14) {
    uVar16 = uVar18;
  }
  lVar37 = (long)pvVar9 + 0xc;
  uVar18 = 0;
  do {
    pBVar34 = local_1b8[uVar18];
    *(undefined8 *)(lVar37 + 0x14) = *(undefined8 *)(pBVar34->pLeaves + 4);
    wVar5 = pBVar34->Sign;
    uVar6 = *(undefined8 *)&pBVar34->Delay;
    uVar7 = *(undefined8 *)(pBVar34->pLeaves + 2);
    *(undefined8 *)(lVar37 + 4) = *(undefined8 *)pBVar34->pLeaves;
    *(undefined8 *)(lVar37 + 0xc) = uVar7;
    *(word *)(lVar37 + -0xc) = wVar5;
    *(undefined8 *)(lVar37 + -4) = uVar6;
    uVar18 = uVar18 + 1;
    lVar37 = lVar37 + 0x28;
  } while (uVar16 != uVar18);
  iVar14 = p->nCutNum;
  uVar8 = (uint)uVar18;
  while ((int)uVar8 < iVar14) {
    *(byte *)(lVar37 + 3) = *(byte *)(lVar37 + 3) | 0xf8;
    lVar37 = lVar37 + 0x28;
    uVar8 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar8;
  }
  Vec_IntPush(p->vCosts,uVar11);
  if (p->vCosts->nSize == p->pNew->nObjs) {
    return uVar11;
  }
  __assert_fail("Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                ,0x1d6,
                "int Bal_ManDeriveCuts(Bal_Man_t *, int, int, int, int, int, int, int, int, int, int, int, int)"
               );
LAB_00681da5:
  lVar37 = lVar37 + 1;
  if (uVar11 == (uint)lVar37) goto LAB_00681f4b;
  goto LAB_00681d64;
}

Assistant:

int Bal_ManDeriveCuts( Bal_Man_t * p, int iFan0, int iFan1, int iFan2, int fCompl0, int fCompl1, int fCompl2, int fUnit0, int fUnit1, int fUnit2, int fIsXor, int Target, int fSave )
{
    Bal_Cut_t pCutSet[BAL_CUT_MAX], * pCutsR[BAL_CUT_MAX];
    Bal_Cut_t * pCutSet0, * pCutSet1, * pCutSet2;
    int nCuts0 = Bal_ManPrepareSet( p, iFan0, 0, fUnit0, &pCutSet0 );
    int nCuts1 = Bal_ManPrepareSet( p, iFan1, 1, fUnit1, &pCutSet1 );
    Bal_Cut_t * pCut0, * pCut0Lim = pCutSet0 + nCuts0;
    Bal_Cut_t * pCut1, * pCut1Lim = pCutSet1 + nCuts1;
    int i, Cost, nCutsR = 0;
    memset( pCutSet, 0, sizeof(Bal_Cut_t) * p->nCutNum );
    for ( i = 0; i < p->nCutNum; i++ )
        pCutsR[i] = pCutSet + i;
    // enumerate cuts
    if ( iFan2 > 0 )
    {
        int nCuts2 = Bal_ManPrepareSet( p, iFan2, 2, fUnit2, &pCutSet2 );
        Bal_Cut_t * pCut2, * pCut2Lim = pCutSet2 + nCuts2;
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCutSet2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fCompl0, fCompl1, fCompl2, pCutsR[nCutsR]) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    else
    {
        for ( pCut0 = pCutSet0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCutSet1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( Bal_CutCountBits(pCut0->Sign | pCut1->Sign) > p->nLutSize )
                continue;
            if ( !Bal_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], p->nLutSize) )
                continue;
            assert( pCutsR[nCutsR]->Delay == Target );
            if ( Bal_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
//            if ( p->fCutMin && Bal_CutComputeTruth(p, pCut0, pCut1, fCompl0, fCompl1, pCutsR[nCutsR], fIsXor) )
//                pCutsR[nCutsR]->Sign = Bal_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            nCutsR = Bal_SetAddCut( pCutsR, nCutsR, p->nCutNum );
        }
    }
    if ( nCutsR == 0 )
        return -1;
//printf( "%d ", nCutsR );
    Cost = ((pCutsR[0]->Delay << 4) | pCutsR[0]->nLeaves);
    // verify
    assert( nCutsR > 0 && nCutsR < p->nCutNum );
    assert( Bal_SetCheckArray(pCutsR, nCutsR) );
    // save cuts
    if ( fSave && Cost >= 0 )
    {
        pCutSet0 = ABC_CALLOC( Bal_Cut_t, p->nCutNum );
        Vec_PtrPush( p->vCutSets, pCutSet0 );
        assert( Vec_PtrSize(p->vCutSets) == Gia_ManObjNum(p->pNew) );
        for ( i = 0; i < nCutsR; i++ )
            pCutSet0[i] = *pCutsR[i];        
        for ( ; i < p->nCutNum; i++ )
            pCutSet0[i].nLeaves = BAL_NO_LEAF;
        Vec_IntPush( p->vCosts, Cost );
        assert( Vec_IntSize(p->vCosts) == Gia_ManObjNum(p->pNew) );
    }
    return Cost;
}